

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rootindexproxymodel.cpp
# Opt level: O0

void __thiscall RootIndexProxyModel::~RootIndexProxyModel(RootIndexProxyModel *this)

{
  RootIndexProxyModelPrivate *this_00;
  bool bVar1;
  const_iterator o;
  Connection *pCVar2;
  const_iterator local_20;
  const_iterator discIter;
  RootIndexProxyModelPrivate *d;
  RootIndexProxyModel *this_local;
  
  *(undefined ***)this = &PTR_metaObject_001d32d0;
  discIter.i = (Connection *)d_func(this);
  local_20 = QList<QMetaObject::Connection>::cbegin((QList<QMetaObject::Connection> *)discIter.i);
  while( true ) {
    o = QList<QMetaObject::Connection>::cend((QList<QMetaObject::Connection> *)discIter.i);
    bVar1 = QList<QMetaObject::Connection>::const_iterator::operator!=(&local_20,o);
    if (!bVar1) break;
    pCVar2 = QList<QMetaObject::Connection>::const_iterator::operator*(&local_20);
    QObject::disconnect(pCVar2);
    QList<QMetaObject::Connection>::const_iterator::operator++(&local_20);
  }
  this_00 = this->m_dptr;
  if (this_00 != (RootIndexProxyModelPrivate *)0x0) {
    RootIndexProxyModelPrivate::~RootIndexProxyModelPrivate(this_00);
    operator_delete(this_00,0x60);
  }
  QIdentityProxyModel::~QIdentityProxyModel(&this->super_QIdentityProxyModel);
  return;
}

Assistant:

RootIndexProxyModel::~RootIndexProxyModel()
{
    Q_D(RootIndexProxyModel);
    for (auto discIter = d->m_sourceConnections.cbegin(); discIter != d->m_sourceConnections.cend(); ++discIter)
        QObject::disconnect(*discIter);
    delete m_dptr;
}